

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::evaluate(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint sourceSize;
  uint Source;
  
  requireDStackDepth(this,2,"EVALUATE");
  SaveInput(this);
  this_00 = &this->dStack;
  sourceSize = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  Source = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  this->sourceid = 0xffffffff;
  setSourceVariables(this,Source,sourceSize,0);
  this->InterpretState = InterpretSource;
  return;
}

Assistant:

void evaluate() {
			REQUIRE_DSTACK_DEPTH(2, "EVALUATE");
			SaveInput();
			auto length = dStack.getTop(); dStack.pop();
			auto caddr = CADDR(dStack.getTop()); dStack.pop();
			setSourceId(-1);
			setSourceVariables(caddr, length, 0);
			InterpretState = InterpretSource;
		}